

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sh.cpp
# Opt level: O0

bool __thiscall CmdSh::Execute(CmdSh *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  element_type *peVar6;
  string local_2a0 [32];
  undefined1 local_280 [8];
  CommandSptr cmd;
  string s;
  int local_250;
  istream local_240 [8];
  ifstream fin;
  string local_38 [8];
  value_type fileName;
  CmdSh *this_local;
  
  sVar3 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_Command).option);
  if (sVar3 == 0) {
    pvVar5 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&(this->super_Command).parameter);
    std::__cxx11::string::string(local_38,(string *)pvVar5);
    std::ifstream::ifstream(local_240,local_38,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"sh: cannot stat \'");
      poVar4 = std::operator<<(poVar4,local_38);
      poVar4 = std::operator<<(poVar4,"\': No such fileName or directory");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      do {
        bVar1 = std::ios::eof();
        if (((bVar1 ^ 0xff) & 1) == 0) break;
        this_00 = &cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::__cxx11::string::string((string *)this_00);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,(string *)this_00);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,"exit");
        if (bVar2) {
          local_250 = 3;
        }
        else {
          std::__cxx11::string::string
                    (local_2a0,
                     (string *)
                     &cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          CmdParser::Parse((CmdParser *)local_280,(string *)&this->field_0x38);
          std::__cxx11::string::~string(local_2a0);
          bVar2 = std::operator!=((shared_ptr<Command> *)local_280,(nullptr_t)0x0);
          if (bVar2) {
            peVar6 = std::__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_280);
            (**peVar6->_vptr_Command)();
          }
          std::shared_ptr<Command>::~shared_ptr((shared_ptr<Command> *)local_280);
          local_250 = 0;
        }
        std::__cxx11::string::~string
                  ((string *)
                   &cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      } while (local_250 == 0);
      this_local._7_1_ = true;
    }
    std::ifstream::~ifstream(local_240);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"sh: invalid option");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdSh::Execute(){
	if(option.size() != 0){
		cout << "sh: invalid option" << endl;
		return false;
	}
	
	auto fileName = parameter.front();
	ifstream fin(fileName);
	if(!fin.is_open()){
		cout << "sh: cannot stat '" << fileName << "': No such fileName or directory" << endl;
		return false;
	}

	while(!fin.eof()){
		string s;
		getline(fin, s);
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}

	return true;
}